

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_pop_front_Test::~IntrusiveListTest_pop_front_Test
          (IntrusiveListTest_pop_front_Test *this)

{
  IntrusiveListTest_pop_front_Test *this_local;
  
  anon_unknown.dwarf_4eaaf::IntrusiveListTest::~IntrusiveListTest(&this->super_IntrusiveListTest);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, pop_front) {
  TestObjectList list = NewList({1, 2, 3, 4});

  list.pop_front();
  AssertListEq(list, {2, 3, 4});
  list.pop_front();
  AssertListEq(list, {3, 4});
  list.pop_front();
  AssertListEq(list, {4});
  list.pop_front();
  AssertListEq(list, {});
}